

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::minorInitialiseDevexFramework(HEkkDual *this)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  
  iVar1 = this->multi_num;
  pdVar2 = &this->multi_choice[0].infeasEdWt;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    *pdVar2 = 1.0;
    pdVar2 = pdVar2 + 0x49;
  }
  this->minor_new_devex_framework = false;
  return;
}

Assistant:

void HEkkDual::minorInitialiseDevexFramework() {
  // Set the local Devex weights to 1
  for (HighsInt i = 0; i < multi_num; i++) {
    multi_choice[i].infeasEdWt = 1.0;
  }
  minor_new_devex_framework = false;
}